

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.h
# Opt level: O2

uint64_t prng_rand(prng_rand_t *state)

{
  uint uVar1;
  uint_fast16_t uVar2;
  long lVar3;
  uint_fast16_t in_RSI;
  bool bVar4;
  
  bVar4 = g_prng_rand_state.c != 0;
  uVar2 = g_prng_rand_state.c - 1;
  g_prng_rand_state.c = 0x36;
  if (bVar4) {
    g_prng_rand_state.c = uVar2;
  }
  lVar3 = 1;
  if (!bVar4) {
    lVar3 = 0x1f0;
  }
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    uVar1 = (uint)g_prng_rand_state.i;
    g_prng_rand_state.s[uVar1 & 0x3f] =
         g_prng_rand_state.s[uVar1 + 9 & 0x3f] + g_prng_rand_state.s[uVar1 + 0x28 & 0x3f];
    in_RSI = g_prng_rand_state.i;
    g_prng_rand_state.i = g_prng_rand_state.i + 1;
  }
  return g_prng_rand_state.s[(uint)in_RSI & 0x3f];
}

Assistant:

static inline uint64_t prng_rand(struct prng_rand_t* state)
{
    uint_fast16_t i;
    uint_fast16_t r, new_rands = 0;

    if (!state->c)
    {   // Randomness exhausted, run forward to refill
        new_rands += RAND_REFILL_COUNT + 1;
        state->c = RAND_EXHAUST_LIMIT - 1;
    }
    else
    {
        new_rands = 1;
        state->c--;
    }

    for (r = 0; r < new_rands; r++)
    {
        i = state->i;
        state->s[i & RAND_SMASK] = state->s[(i + RAND_SSIZE - LAG1) & RAND_SMASK]
                                   + state->s[(i + RAND_SSIZE - LAG2) & RAND_SMASK];
        state->i++;
    }
    return state->s[i & RAND_SMASK];
}